

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

char * rsrc_basename(char *name,size_t name_length)

{
  char *pcVar1;
  void *pvVar2;
  char *__s;
  
  pcVar1 = name;
  do {
    __s = pcVar1;
    pvVar2 = memchr(__s,0x2f,(size_t)(name + (name_length - (long)__s)));
    pcVar1 = (char *)((long)pvVar2 + 1);
  } while (pvVar2 != (void *)0x0);
  return __s;
}

Assistant:

static const char *
rsrc_basename(const char *name, size_t name_length)
{
	const char *s, *r;

	r = s = name;
	for (;;) {
		s = memchr(s, '/', name_length - (s - name));
		if (s == NULL)
			break;
		r = ++s;
	}
	return (r);
}